

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

_Bool regime_translation_disabled(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  ulong uVar1;
  uint uVar2;
  uint32_t uVar3;
  _Bool _Var4;
  
  if ((env->features & 0x200) == 0) {
    uVar1 = (env->cp15).hcr_el2;
    if (mmu_idx == ARMMMUIdx_Stage2) {
      _Var4 = (uVar1 & 0x1001) == 0;
    }
    else {
      if (((uint)uVar1 >> 0x1b & 1) != 0) {
        uVar2 = mmu_idx - ARMMMUIdx_E10_0;
        if (0x37 < uVar2) {
LAB_0061a56e:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                     ,0x37c,(char *)0x0);
        }
        if ((0xf00000007087fU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
          if ((0xf0000000000780U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_0061a56e;
        }
        else {
          uVar3 = regime_el(env,mmu_idx);
          if (uVar3 == 1) {
            return true;
          }
        }
      }
      if ((2 < mmu_idx - ARMMMUIdx_Stage1_E0) || (_Var4 = true, ((env->cp15).hcr_el2 & 0x1000) == 0)
         ) {
        uVar3 = regime_el(env,mmu_idx);
        _Var4 = ((env->cp15).cptr_el[(ulong)uVar3 - 5] & 1) == 0;
      }
    }
  }
  else {
    uVar2 = mmu_idx - ARMMMUIdx_E10_0;
    if ((0x37 < uVar2) || ((0xff000000070fffU >> ((ulong)uVar2 & 0x3f) & 1) == 0))
    goto LAB_0061a56e;
    switch((env->v7m).mpu_ctrl[*(long *)(&DAT_00d7d578 + (ulong)uVar2 * 8)] & 3) {
    default:
      _Var4 = true;
      break;
    case 1:
      _Var4 = SUB41((mmu_idx & 2) >> 1,0);
      break;
    case 3:
      _Var4 = false;
    }
  }
  return _Var4;
}

Assistant:

static inline bool regime_translation_disabled(CPUARMState *env,
                                               ARMMMUIdx mmu_idx)
{
    if (arm_feature(env, ARM_FEATURE_M)) {
        switch (env->v7m.mpu_ctrl[regime_is_secure(env, mmu_idx)] &
                (R_V7M_MPU_CTRL_ENABLE_MASK | R_V7M_MPU_CTRL_HFNMIENA_MASK)) {
        case R_V7M_MPU_CTRL_ENABLE_MASK:
            /* Enabled, but not for HardFault and NMI */
            return mmu_idx & ARM_MMU_IDX_M_NEGPRI;
        case R_V7M_MPU_CTRL_ENABLE_MASK | R_V7M_MPU_CTRL_HFNMIENA_MASK:
            /* Enabled for all cases */
            return false;
        case 0:
        default:
            /* HFNMIENA set and ENABLE clear is UNPREDICTABLE, but
             * we warned about that in armv7m_nvic.c when the guest set it.
             */
            return true;
        }
    }

    if (mmu_idx == ARMMMUIdx_Stage2) {
        /* HCR.DC means HCR.VM behaves as 1 */
        return (env->cp15.hcr_el2 & (HCR_DC | HCR_VM)) == 0;
    }

    if (env->cp15.hcr_el2 & HCR_TGE) {
        /* TGE means that NS EL0/1 act as if SCTLR_EL1.M is zero */
        if (!regime_is_secure(env, mmu_idx) && regime_el(env, mmu_idx) == 1) {
            return true;
        }
    }

    if ((env->cp15.hcr_el2 & HCR_DC) && arm_mmu_idx_is_stage1_of_2(mmu_idx)) {
        /* HCR.DC means SCTLR_EL1.M behaves as 0 */
        return true;
    }

    return (regime_sctlr(env, mmu_idx) & SCTLR_M) == 0;
}